

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall TempDir::TempDir(TempDir *this,path *pt)

{
  pointer pcVar1;
  
  this->_vptr_TempDir = (_func_int **)&PTR__TempDir_001168d0;
  (this->p).m_pathname._M_dataplus._M_p = (pointer)&(this->p).m_pathname.field_2;
  pcVar1 = (pt->m_pathname)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->p,pcVar1,pcVar1 + (pt->m_pathname)._M_string_length);
  boost::filesystem::detail::create_directory(&this->p,(path *)0x0,(error_code *)0x0);
  return;
}

Assistant:

TempDir(path pt) : p(pt) {
    create_directory(p);
  }